

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::MemoryDataParameter::MergePartialFromCodedStream
          (MemoryDataParameter *this,CodedInputStream *input)

{
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  uint32 uVar4;
  byte *pbVar5;
  long lVar6;
  UnknownFieldSet *unknown_fields;
  char cVar7;
  uint tag;
  ulong uVar8;
  
LAB_003b016a:
  do {
    pbVar5 = input->buffer_;
    uVar4 = 0;
    if (pbVar5 < input->buffer_end_) {
      bVar1 = *pbVar5;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b018e;
      input->buffer_ = pbVar5 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b018e:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar8 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar4 | uVar8;
    }
    tag = (uint)uVar8;
    if ((uVar8 & 0x100000000) != 0) {
      cVar7 = (char)uVar8;
      switch((uint)(uVar8 >> 3) & 0x1fffffff) {
      case 1:
        if (cVar7 == '\b') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pbVar5 = input->buffer_;
          if (pbVar5 < input->buffer_end_) {
            bVar1 = *pbVar5;
            uVar4 = (uint32)bVar1;
            if (-1 < (char)bVar1) {
              this->batch_size_ = (uint)bVar1;
LAB_003b029f:
              input->buffer_ = pbVar5 + 1;
              goto LAB_003b016a;
            }
          }
          else {
            uVar4 = 0;
          }
          lVar6 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
          this->batch_size_ = (uint32)lVar6;
LAB_003b02f8:
          if (lVar6 < 0) {
            return false;
          }
          goto LAB_003b016a;
        }
        break;
      case 2:
        if (cVar7 == '\x10') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pbVar5 = input->buffer_;
          if (pbVar5 < input->buffer_end_) {
            bVar1 = *pbVar5;
            uVar4 = (uint32)bVar1;
            if (-1 < (char)bVar1) {
              this->channels_ = (uint)bVar1;
              goto LAB_003b029f;
            }
          }
          else {
            uVar4 = 0;
          }
          lVar6 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
          this->channels_ = (uint32)lVar6;
          goto LAB_003b02f8;
        }
        break;
      case 3:
        if (cVar7 == '\x18') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          pbVar5 = input->buffer_;
          if (pbVar5 < input->buffer_end_) {
            bVar1 = *pbVar5;
            uVar4 = (uint32)bVar1;
            if (-1 < (char)bVar1) {
              this->height_ = (uint)bVar1;
              goto LAB_003b029f;
            }
          }
          else {
            uVar4 = 0;
          }
          lVar6 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
          this->height_ = (uint32)lVar6;
          goto LAB_003b02f8;
        }
        break;
      case 4:
        if (cVar7 == ' ') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          pbVar5 = input->buffer_;
          if (pbVar5 < input->buffer_end_) {
            bVar1 = *pbVar5;
            uVar4 = (uint32)bVar1;
            if (-1 < (char)bVar1) {
              this->width_ = (uint)bVar1;
              goto LAB_003b029f;
            }
          }
          else {
            uVar4 = 0;
          }
          lVar6 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
          this->width_ = (uint32)lVar6;
          goto LAB_003b02f8;
        }
      }
    }
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    pvVar2 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar2 & 1) == 0) {
      unknown_fields =
           google::protobuf::internal::
           InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ::mutable_unknown_fields_slow
                     (&(this->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     );
    }
    else {
      unknown_fields = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
    }
    bVar3 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
    if (!bVar3) {
      return false;
    }
  } while( true );
}

Assistant:

bool MemoryDataParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.MemoryDataParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 batch_size = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_batch_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &batch_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 channels = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_channels();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &channels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 height = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_height();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 width = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_width();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.MemoryDataParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.MemoryDataParameter)
  return false;
#undef DO_
}